

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alcmain.h
# Opt level: O2

void __thiscall DistanceComp::setSampleCount(DistanceComp *this,size_t new_size)

{
  __uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_> __p
  ;
  __uniq_ptr_data<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>,_true,_true>
  in_RAX;
  __uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl =
       (tuple<al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>)
       (tuple<al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>)
       in_RAX.
       super___uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
       .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl;
  al::FlexArray<float,_16UL>::Create((FlexArray<float,_16UL> *)&stack0xffffffffffffffe8,new_size);
  __p._M_t.
  super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
       .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl =
       (tuple<al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>)
       (_Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>::
  reset((__uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
         *)&this->mSamples,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                 .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl);
  std::unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>::
  ~unique_ptr((unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
               *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void setSampleCount(size_t new_size)
    { mSamples = FloatArray::Create(new_size); }